

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O2

vector<CAddress,_std::allocator<CAddress>_> * __thiscall
AddrManImpl::GetAddr_
          (vector<CAddress,_std::allocator<CAddress>_> *__return_storage_ptr__,AddrManImpl *this,
          size_t max_addresses,size_t max_pct,optional<Network> network,bool filtered)

{
  bool bVar1;
  Network NVar2;
  ulong uVar3;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> now;
  const_iterator cVar4;
  ulong uVar5;
  unsigned_long uVar6;
  uint nRndPos1;
  ulong uVar7;
  AddrInfo *this_00;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  unsigned_long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (long)(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (max_pct != 0) {
    uVar3 = (uVar3 * max_pct) / 100;
  }
  uVar5 = max_addresses;
  if (uVar3 < max_addresses) {
    uVar5 = uVar3;
  }
  if (max_addresses == 0) {
    uVar5 = uVar3;
  }
  now = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nRndPos1 = 0;
  do {
    uVar7 = (ulong)nRndPos1;
    uVar3 = (long)(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    uVar6 = uVar3 - uVar7;
    if ((uVar3 < uVar7 || uVar6 == 0) ||
       (uVar5 <= (ulong)(((long)(__return_storage_ptr__->
                                super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(__return_storage_ptr__->
                               super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                               super__Vector_impl_data._M_start) / 0x38))) {
      bVar1 = ::LogAcceptCategory(ADDRMAN,(Level)uVar6);
      if (bVar1) {
        local_40 = ((long)(__return_storage_ptr__->
                          super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(__return_storage_ptr__->
                         super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                         super__Vector_impl_data._M_start) / 0x38;
        logging_function._M_str = "GetAddr_";
        logging_function._M_len = 8;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
        ;
        source_file._M_len = 0x5b;
        LogPrintFormatInternal<unsigned_long>
                  (logging_function,source_file,0x34e,ADDRMAN,Debug,
                   (ConstevalFormatString<1U>)0x6caf64,&local_40);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    uVar6 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                      (&(this->insecure_rand).super_RandomMixin<FastRandomContext>,uVar6);
    SwapRandom(this,nRndPos1,(int)uVar6 + nRndPos1);
    cVar4 = std::
            _Hashtable<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->mapInfo)._M_h,
                   (this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar7);
    if (cVar4.super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>._M_cur ==
        (__node_type *)0x0) {
      __assert_fail("it != mapInfo.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                    ,0x342,
                    "std::vector<CAddress> AddrManImpl::GetAddr_(size_t, size_t, std::optional<Network>, const bool) const"
                   );
    }
    this_00 = (AddrInfo *)
              ((long)cVar4.super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>._M_cur
              + 0x10);
    if (((ulong)network.super__Optional_base<Network,_true,_true>._M_payload.
                super__Optional_payload_base<Network> >> 0x20 & 1) == 0) {
LAB_0039b702:
      bVar1 = AddrInfo::IsTerrible(this_00,(NodeSeconds)now.__d.__r);
      if (!filtered || !bVar1) {
        std::vector<CAddress,_std::allocator<CAddress>_>::push_back
                  (__return_storage_ptr__,(value_type *)this_00);
      }
    }
    else {
      NVar2 = CNetAddr::GetNetClass((CNetAddr *)this_00);
      if (NVar2 == network.super__Optional_base<Network,_true,_true>._M_payload.
                   super__Optional_payload_base<Network>._M_payload) goto LAB_0039b702;
    }
    nRndPos1 = nRndPos1 + 1;
  } while( true );
}

Assistant:

std::vector<CAddress> AddrManImpl::GetAddr_(size_t max_addresses, size_t max_pct, std::optional<Network> network, const bool filtered) const
{
    AssertLockHeld(cs);

    size_t nNodes = vRandom.size();
    if (max_pct != 0) {
        nNodes = max_pct * nNodes / 100;
    }
    if (max_addresses != 0) {
        nNodes = std::min(nNodes, max_addresses);
    }

    // gather a list of random nodes, skipping those of low quality
    const auto now{Now<NodeSeconds>()};
    std::vector<CAddress> addresses;
    for (unsigned int n = 0; n < vRandom.size(); n++) {
        if (addresses.size() >= nNodes)
            break;

        int nRndPos = insecure_rand.randrange(vRandom.size() - n) + n;
        SwapRandom(n, nRndPos);
        const auto it{mapInfo.find(vRandom[n])};
        assert(it != mapInfo.end());

        const AddrInfo& ai{it->second};

        // Filter by network (optional)
        if (network != std::nullopt && ai.GetNetClass() != network) continue;

        // Filter for quality
        if (ai.IsTerrible(now) && filtered) continue;

        addresses.push_back(ai);
    }
    LogDebug(BCLog::ADDRMAN, "GetAddr returned %d random addresses\n", addresses.size());
    return addresses;
}